

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  GridSOA *pGVar10;
  Geometry *pGVar11;
  GridSOA *pGVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  GridSOA *pGVar29;
  Device *pDVar30;
  RTCRayN *pRVar31;
  GridSOA *pGVar32;
  int iVar33;
  size_t sVar34;
  Geometry *pGVar35;
  RTCIntersectArguments *pRVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  undefined4 uVar40;
  ulong unaff_RBP;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  float fVar74;
  float fVar75;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar69;
  undefined1 auVar70 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar73;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar103;
  float fVar105;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar95;
  undefined1 auVar98 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar99;
  float fVar104;
  float fVar106;
  float fVar107;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar108;
  float fVar125;
  float fVar126;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar112;
  float fVar127;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [12];
  undefined1 auVar129 [12];
  uint uVar135;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar136;
  float fVar142;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar139;
  float fVar143;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar144;
  undefined1 auVar145 [12];
  undefined1 auVar146 [12];
  float fVar154;
  undefined1 auVar147 [16];
  float fVar156;
  float fVar157;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar155;
  float fVar158;
  undefined1 auVar153 [16];
  float fVar159;
  float fVar160;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar182;
  float fVar183;
  float fVar188;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  int iStack_12f0;
  undefined8 local_12d8;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1288;
  undefined8 uStack_1280;
  vbool<4> valid;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  GridSOA *local_1230;
  ulong local_1228;
  ulong local_1220;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1198 [4];
  float local_1188 [4];
  float local_1178 [4];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 *local_1120;
  ulong local_1118;
  StackItemT<embree::NodeRefPtr<4>_> *local_1110;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  ulong local_1098;
  ulong local_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined4 local_1008;
  undefined4 uStack_1004;
  undefined4 uStack_1000;
  undefined4 uStack_ffc;
  undefined1 local_ff8 [16];
  undefined4 local_fe8;
  undefined4 uStack_fe4;
  undefined4 uStack_fe0;
  undefined4 uStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar116 [16];
  undefined1 auVar121 [16];
  undefined1 auVar184 [16];
  
  local_1110 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar103 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar75 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar106 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar182 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar189 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar194 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar208 = fVar182 * 0.99999964;
  fVar209 = fVar189 * 0.99999964;
  fVar199 = fVar194 * 0.99999964;
  fVar182 = fVar182 * 1.0000004;
  fVar189 = fVar189 * 1.0000004;
  fVar194 = fVar194 * 1.0000004;
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1098 = uVar44 ^ 0x10;
  local_1090 = uVar43;
  iVar37 = (tray->tnear).field_0.i[k];
  auVar57._4_4_ = iVar37;
  auVar57._0_4_ = iVar37;
  auVar57._8_4_ = iVar37;
  auVar57._12_4_ = iVar37;
  iVar37 = (tray->tfar).field_0.i[k];
  auVar58._4_4_ = iVar37;
  auVar58._0_4_ = iVar37;
  auVar58._8_4_ = iVar37;
  auVar58._12_4_ = iVar37;
  local_1120 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1108 = fVar103;
  fStack_1104 = fVar103;
  fStack_1100 = fVar103;
  fStack_10fc = fVar103;
  local_1018 = fVar75;
  fStack_1014 = fVar75;
  fStack_1010 = fVar75;
  fStack_100c = fVar75;
  local_1028 = fVar106;
  fStack_1024 = fVar106;
  fStack_1020 = fVar106;
  fStack_101c = fVar106;
  local_1038 = fVar182;
  fStack_1034 = fVar182;
  fStack_1030 = fVar182;
  fStack_102c = fVar182;
  local_1048 = fVar189;
  fStack_1044 = fVar189;
  fStack_1040 = fVar189;
  fStack_103c = fVar189;
  local_1058 = fVar194;
  fStack_1054 = fVar194;
  fStack_1050 = fVar194;
  fStack_104c = fVar194;
  local_1068 = fVar199;
  fStack_1064 = fVar199;
  fStack_1060 = fVar199;
  fStack_105c = fVar199;
  local_1078 = fVar208;
  fStack_1074 = fVar208;
  fStack_1070 = fVar208;
  fStack_106c = fVar208;
  local_1088 = fVar209;
  fStack_1084 = fVar209;
  fStack_1080 = fVar209;
  fStack_107c = fVar209;
  local_1118 = uVar44;
  local_10f8 = auVar57;
  fVar166 = fVar189;
  fVar143 = fVar189;
  fVar173 = fVar189;
  fVar197 = fVar194;
  fVar198 = fVar194;
  fVar179 = fVar194;
  fVar155 = fVar199;
  fVar95 = fVar199;
  fVar158 = fVar199;
  fVar74 = fVar208;
  fVar94 = fVar208;
  fVar104 = fVar208;
  fVar105 = fVar209;
  fVar107 = fVar209;
  fVar108 = fVar209;
  fVar125 = fVar103;
  fVar126 = fVar103;
  fVar127 = fVar103;
  fVar136 = fVar75;
  fVar142 = fVar75;
  fVar144 = fVar75;
  fVar154 = fVar106;
  fVar156 = fVar106;
  fVar157 = fVar106;
  fVar159 = fVar182;
  fVar160 = fVar182;
  fVar163 = fVar182;
  while (local_1110 != stack) {
    pSVar25 = local_1110 + -1;
    local_1110 = local_1110 + -1;
    if ((float)pSVar25->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar25->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar28 = (local_1110->ptr).ptr;
      do {
        if ((uVar28 & 8) == 0) {
          pfVar4 = (float *)(uVar28 + 0x20 + uVar44);
          auVar47._0_4_ = (*pfVar4 - fVar103) * fVar208;
          auVar47._4_4_ = (pfVar4[1] - fVar125) * fVar74;
          auVar47._8_4_ = (pfVar4[2] - fVar126) * fVar94;
          auVar47._12_4_ = (pfVar4[3] - fVar127) * fVar104;
          pfVar4 = (float *)(uVar28 + 0x20 + local_1090);
          auVar101._0_4_ = (*pfVar4 - fVar75) * fVar209;
          auVar101._4_4_ = (pfVar4[1] - fVar136) * fVar105;
          auVar101._8_4_ = (pfVar4[2] - fVar142) * fVar107;
          auVar101._12_4_ = (pfVar4[3] - fVar144) * fVar108;
          auVar47 = maxps(auVar47,auVar101);
          pfVar4 = (float *)(uVar28 + 0x20 + uVar42);
          auVar150._0_4_ = (*pfVar4 - fVar106) * fVar199;
          auVar150._4_4_ = (pfVar4[1] - fVar154) * fVar155;
          auVar150._8_4_ = (pfVar4[2] - fVar156) * fVar95;
          auVar150._12_4_ = (pfVar4[3] - fVar157) * fVar158;
          auVar96 = maxps(auVar150,auVar57);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar47,auVar96);
          pfVar4 = (float *)(uVar28 + 0x20 + local_1098);
          auVar97._0_4_ = (*pfVar4 - fVar103) * fVar182;
          auVar97._4_4_ = (pfVar4[1] - fVar125) * fVar159;
          auVar97._8_4_ = (pfVar4[2] - fVar126) * fVar160;
          auVar97._12_4_ = (pfVar4[3] - fVar127) * fVar163;
          pfVar4 = (float *)(uVar28 + 0x20 + (uVar43 ^ 0x10));
          auVar109._0_4_ = (*pfVar4 - fVar75) * fVar189;
          auVar109._4_4_ = (pfVar4[1] - fVar136) * fVar166;
          auVar109._8_4_ = (pfVar4[2] - fVar142) * fVar143;
          auVar109._12_4_ = (pfVar4[3] - fVar144) * fVar173;
          auVar47 = minps(auVar97,auVar109);
          pfVar4 = (float *)(uVar28 + 0x20 + (uVar42 ^ 0x10));
          auVar110._0_4_ = (*pfVar4 - fVar106) * fVar194;
          auVar110._4_4_ = (pfVar4[1] - fVar154) * fVar197;
          auVar110._8_4_ = (pfVar4[2] - fVar156) * fVar198;
          auVar110._12_4_ = (pfVar4[3] - fVar157) * fVar179;
          auVar96 = minps(auVar110,auVar58);
          auVar47 = minps(auVar47,auVar96);
          auVar96._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar47._4_4_);
          auVar96._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar47._0_4_);
          auVar96._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar47._8_4_);
          auVar96._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar47._12_4_);
          uVar40 = movmskps((int)unaff_RBP,auVar96);
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar40);
        }
        if ((uVar28 & 8) == 0) {
          if (unaff_RBP == 0) {
            iStack_12f0 = 4;
          }
          else {
            uVar27 = uVar28 & 0xfffffffffffffff0;
            lVar46 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
              }
            }
            iStack_12f0 = 0;
            uVar28 = *(ulong *)(uVar27 + lVar46 * 8);
            uVar41 = unaff_RBP - 1 & unaff_RBP;
            if (uVar41 != 0) {
              uVar39 = tNear.field_0.i[lVar46];
              lVar46 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              uVar8 = *(ulong *)(uVar27 + lVar46 * 8);
              uVar7 = tNear.field_0.i[lVar46];
              uVar41 = uVar41 - 1 & uVar41;
              if (uVar41 == 0) {
                if (uVar39 < uVar7) {
                  (local_1110->ptr).ptr = uVar8;
                  local_1110->dist = uVar7;
                  local_1110 = local_1110 + 1;
                }
                else {
                  (local_1110->ptr).ptr = uVar28;
                  local_1110->dist = uVar39;
                  uVar28 = uVar8;
                  local_1110 = local_1110 + 1;
                }
              }
              else {
                auVar98._8_4_ = uVar39;
                auVar98._0_8_ = uVar28;
                auVar98._12_4_ = 0;
                auVar137._8_4_ = uVar7;
                auVar137._0_8_ = uVar8;
                auVar137._12_4_ = 0;
                lVar46 = 0;
                if (uVar41 != 0) {
                  for (; (uVar41 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                  }
                }
                uVar9 = *(undefined8 *)(uVar27 + lVar46 * 8);
                iVar37 = tNear.field_0.i[lVar46];
                auVar111._8_4_ = iVar37;
                auVar111._0_8_ = uVar9;
                auVar111._12_4_ = 0;
                auVar48._8_4_ = -(uint)((int)uVar39 < (int)uVar7);
                uVar41 = uVar41 - 1 & uVar41;
                fVar125 = fStack_1104;
                fVar126 = fStack_1100;
                fVar127 = fStack_10fc;
                fVar103 = local_1108;
                if (uVar41 == 0) {
                  auVar48._4_4_ = auVar48._8_4_;
                  auVar48._0_4_ = auVar48._8_4_;
                  auVar48._12_4_ = auVar48._8_4_;
                  auVar130._8_4_ = uVar7;
                  auVar130._0_8_ = uVar8;
                  auVar130._12_4_ = 0;
                  auVar96 = blendvps(auVar130,auVar98,auVar48);
                  auVar47 = blendvps(auVar98,auVar137,auVar48);
                  auVar49._8_4_ = -(uint)(auVar96._8_4_ < iVar37);
                  auVar49._4_4_ = auVar49._8_4_;
                  auVar49._0_4_ = auVar49._8_4_;
                  auVar49._12_4_ = auVar49._8_4_;
                  auVar138._8_4_ = iVar37;
                  auVar138._0_8_ = uVar9;
                  auVar138._12_4_ = 0;
                  auVar101 = blendvps(auVar138,auVar96,auVar49);
                  auVar96 = blendvps(auVar96,auVar111,auVar49);
                  auVar50._8_4_ = -(uint)(auVar47._8_4_ < auVar96._8_4_);
                  auVar50._4_4_ = auVar50._8_4_;
                  auVar50._0_4_ = auVar50._8_4_;
                  auVar50._12_4_ = auVar50._8_4_;
                  SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar96,auVar47,auVar50);
                  SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar47,auVar96,auVar50);
                  *local_1110 = SVar99;
                  local_1110[1] = SVar112;
                  uVar28 = auVar101._0_8_;
                  local_1110 = local_1110 + 2;
                }
                else {
                  lVar46 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                    }
                  }
                  auVar51._4_4_ = auVar48._8_4_;
                  auVar51._0_4_ = auVar48._8_4_;
                  auVar51._8_4_ = auVar48._8_4_;
                  auVar51._12_4_ = auVar48._8_4_;
                  auVar96 = blendvps(auVar137,auVar98,auVar51);
                  auVar57 = blendvps(auVar98,auVar137,auVar51);
                  auVar147._8_4_ = tNear.field_0.i[lVar46];
                  auVar147._0_8_ = *(undefined8 *)(uVar27 + lVar46 * 8);
                  auVar147._12_4_ = 0;
                  auVar52._8_4_ = -(uint)(iVar37 < tNear.field_0.i[lVar46]);
                  auVar52._4_4_ = auVar52._8_4_;
                  auVar52._0_4_ = auVar52._8_4_;
                  auVar52._12_4_ = auVar52._8_4_;
                  auVar101 = blendvps(auVar147,auVar111,auVar52);
                  auVar47 = blendvps(auVar111,auVar147,auVar52);
                  auVar53._8_4_ = -(uint)(auVar57._8_4_ < auVar47._8_4_);
                  auVar53._4_4_ = auVar53._8_4_;
                  auVar53._0_4_ = auVar53._8_4_;
                  auVar53._12_4_ = auVar53._8_4_;
                  auVar150 = blendvps(auVar47,auVar57,auVar53);
                  SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar57,auVar47,auVar53);
                  auVar54._8_4_ = -(uint)(auVar96._8_4_ < auVar101._8_4_);
                  auVar54._4_4_ = auVar54._8_4_;
                  auVar54._0_4_ = auVar54._8_4_;
                  auVar54._12_4_ = auVar54._8_4_;
                  auVar57 = blendvps(auVar101,auVar96,auVar54);
                  auVar47 = blendvps(auVar96,auVar101,auVar54);
                  auVar55._8_4_ = -(uint)(auVar47._8_4_ < auVar150._8_4_);
                  auVar55._4_4_ = auVar55._8_4_;
                  auVar55._0_4_ = auVar55._8_4_;
                  auVar55._12_4_ = auVar55._8_4_;
                  SVar139 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar150,auVar47,auVar55);
                  SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar47,auVar150,auVar55);
                  *local_1110 = SVar99;
                  local_1110[1] = SVar112;
                  local_1110[2] = SVar139;
                  uVar28 = auVar57._0_8_;
                  local_1110 = local_1110 + 3;
                  auVar57 = local_10f8;
                }
              }
            }
          }
        }
        else {
          iStack_12f0 = 6;
        }
      } while (iStack_12f0 == 0);
      if (iStack_12f0 == 6) {
        if (((uint)uVar28 & 0xf) == 8) {
          pGVar10 = (pre->super_Precalculations).grid;
          uVar39 = *(uint *)(pGVar10 + 0xc);
          uVar27 = (ulong)uVar39;
          lVar46 = (uVar28 >> 4) * 4 + (ulong)*(uint *)(pGVar10 + 0x24);
          pGVar32 = pGVar10 + (uVar28 >> 4) * 4 + (ulong)*(uint *)(pGVar10 + 0x24) + 0x2c;
          fVar103 = *(float *)(pGVar32 + 4);
          pGVar29 = pGVar10 + uVar27 * 4 + lVar46 + 0x2c;
          fVar75 = *(float *)(pGVar29 + 4);
          fVar106 = *(float *)(pGVar32 + 8);
          fVar182 = *(float *)(pGVar29 + 8);
          if (uVar27 == 2) {
            fVar106 = fVar103;
            fVar182 = fVar75;
          }
          uVar28 = (ulong)*(uint *)(pGVar10 + 0x14);
          lVar45 = uVar28 * 4 + lVar46;
          fVar189 = *(float *)(pGVar10 + lVar45 + 0x30);
          pGVar1 = pGVar10 + lVar45 + 0x2c + uVar27 * 4;
          fVar194 = *(float *)(pGVar1 + 4);
          fVar166 = *(float *)(pGVar10 + lVar45 + 0x34);
          fVar143 = *(float *)(pGVar1 + 8);
          if (uVar27 == 2) {
            fVar166 = fVar189;
            fVar143 = fVar194;
          }
          lVar26 = uVar28 * 8 + lVar46;
          fVar173 = *(float *)(pGVar10 + lVar26 + 0x30);
          pGVar12 = pGVar10 + lVar26 + 0x2c + uVar27 * 4;
          fVar197 = *(float *)(pGVar12 + 4);
          fVar198 = *(float *)(pGVar12 + 8);
          fVar179 = *(float *)(pGVar10 + lVar26 + 0x34);
          if (uVar27 == 2) {
            fVar198 = fVar197;
            fVar179 = fVar173;
          }
          uVar41 = (ulong)*(uint *)(pGVar10 + 0x10);
          local_1230 = pGVar10 + uVar28 * 0xc + lVar46 + 0x2c;
          uVar7 = *(uint *)(pGVar10 + 0x18);
          uStack_1280._0_4_ = *(undefined4 *)(pGVar10 + 0x1c);
          fVar199 = *(float *)(ray + k * 4);
          fVar155 = *(float *)(ray + k * 4 + 0x10);
          fVar95 = *(float *)(ray + k * 4 + 0x20);
          fVar158 = *(float *)(ray + k * 4 + 0x40);
          local_10a8 = *(float *)pGVar32 - fVar199;
          fStack_10a4 = *(float *)pGVar29 - fVar199;
          fStack_10a0 = fVar103 - fVar199;
          fStack_109c = fVar75 - fVar199;
          local_10b8 = *(float *)(pGVar10 + lVar45 + 0x2c) - fVar155;
          fStack_10b4 = *(float *)pGVar1 - fVar155;
          fStack_10b0 = fVar189 - fVar155;
          fStack_10ac = fVar194 - fVar155;
          fVar200 = *(float *)(pGVar10 + lVar26 + 0x2c) - fVar95;
          fVar202 = *(float *)pGVar12 - fVar95;
          fVar204 = fVar173 - fVar95;
          fVar206 = fVar197 - fVar95;
          fVar94 = fVar103 - fVar199;
          fVar103 = fVar103 - fVar199;
          fVar209 = fVar106 - fVar199;
          fVar106 = fVar106 - fVar199;
          fVar159 = fVar189 - fVar155;
          fVar189 = fVar189 - fVar155;
          fVar164 = fVar166 - fVar155;
          fVar166 = fVar166 - fVar155;
          fVar168 = fVar173 - fVar95;
          fVar173 = fVar173 - fVar95;
          fVar176 = fVar179 - fVar95;
          fVar179 = fVar179 - fVar95;
          fVar208 = *(float *)pGVar29 - fVar199;
          fVar74 = fVar75 - fVar199;
          fVar75 = fVar75 - fVar199;
          fVar182 = fVar182 - fVar199;
          fVar136 = *(float *)pGVar1 - fVar155;
          fVar142 = fVar194 - fVar155;
          fVar194 = fVar194 - fVar155;
          fVar143 = fVar143 - fVar155;
          fVar195 = *(float *)pGVar12 - fVar95;
          fVar196 = fVar197 - fVar95;
          fVar197 = fVar197 - fVar95;
          fVar198 = fVar198 - fVar95;
          fVar169 = fVar208 - local_10a8;
          fVar174 = fVar74 - fStack_10a4;
          fVar177 = fVar75 - fStack_10a0;
          fVar180 = fVar182 - fStack_109c;
          fVar95 = fVar136 - local_10b8;
          fVar104 = fVar142 - fStack_10b4;
          fVar105 = fVar194 - fStack_10b0;
          fVar107 = fVar143 - fStack_10ac;
          fVar210 = fVar195 - fVar200;
          fVar211 = fVar196 - fVar202;
          fStack_1240 = fVar197 - fVar204;
          fStack_123c = fVar198 - fVar206;
          local_1138 = CONCAT44(fVar174,fVar169);
          uStack_1130 = CONCAT44(fVar180,fVar177);
          fVar199 = *(float *)(ray + k * 4 + 0x50);
          fVar155 = *(float *)(ray + k * 4 + 0x60);
          fVar160 = local_10a8 - fVar94;
          fVar163 = fStack_10a4 - fVar103;
          fVar165 = fStack_10a0 - fVar209;
          fVar167 = fStack_109c - fVar106;
          fVar183 = (fVar95 * (fVar195 + fVar200) - (fVar136 + local_10b8) * fVar210) * fVar158 +
                    ((fVar208 + local_10a8) * fVar210 - (fVar195 + fVar200) * fVar169) * fVar199 +
                    (fVar169 * (fVar136 + local_10b8) - (fVar208 + local_10a8) * fVar95) * fVar155;
          fVar188 = (fVar104 * (fVar196 + fVar202) - (fVar142 + fStack_10b4) * fVar211) * fVar158 +
                    ((fVar74 + fStack_10a4) * fVar211 - (fVar196 + fVar202) * fVar174) * fVar199 +
                    (fVar174 * (fVar142 + fStack_10b4) - (fVar74 + fStack_10a4) * fVar104) * fVar155
          ;
          auVar184._0_8_ = CONCAT44(fVar188,fVar183);
          auVar184._8_4_ =
               (fVar105 * (fVar197 + fVar204) - (fVar194 + fStack_10b0) * fStack_1240) * fVar158 +
               ((fVar75 + fStack_10a0) * fStack_1240 - (fVar197 + fVar204) * fVar177) * fVar199 +
               (fVar177 * (fVar194 + fStack_10b0) - (fVar75 + fStack_10a0) * fVar105) * fVar155;
          auVar184._12_4_ =
               (fVar107 * (fVar198 + fVar206) - (fVar143 + fStack_10ac) * fStack_123c) * fVar158 +
               ((fVar182 + fStack_109c) * fStack_123c - (fVar198 + fVar206) * fVar180) * fVar199 +
               (fVar180 * (fVar143 + fStack_10ac) - (fVar182 + fStack_109c) * fVar107) * fVar155;
          fVar170 = local_10b8 - fVar159;
          fVar175 = fStack_10b4 - fVar189;
          fVar178 = fStack_10b0 - fVar164;
          fVar181 = fStack_10ac - fVar166;
          local_10c8 = fVar200 - fVar168;
          fStack_10c4 = fVar202 - fVar173;
          fStack_10c0 = fVar204 - fVar176;
          fStack_10bc = fVar206 - fVar179;
          fVar190 = (fVar170 * (fVar200 + fVar168) - (local_10b8 + fVar159) * local_10c8) * fVar158
                    + ((local_10a8 + fVar94) * local_10c8 - (fVar200 + fVar168) * fVar160) * fVar199
                      + (fVar160 * (local_10b8 + fVar159) - (local_10a8 + fVar94) * fVar170) *
                        fVar155;
          fVar191 = (fVar175 * (fVar202 + fVar173) - (fStack_10b4 + fVar189) * fStack_10c4) *
                    fVar158 + ((fStack_10a4 + fVar103) * fStack_10c4 - (fVar202 + fVar173) * fVar163
                              ) * fVar199 +
                              (fVar163 * (fStack_10b4 + fVar189) - (fStack_10a4 + fVar103) * fVar175
                              ) * fVar155;
          fVar192 = (fVar178 * (fVar204 + fVar176) - (fStack_10b0 + fVar164) * fStack_10c0) *
                    fVar158 + ((fStack_10a0 + fVar209) * fStack_10c0 - (fVar204 + fVar176) * fVar165
                              ) * fVar199 +
                              (fVar165 * (fStack_10b0 + fVar164) - (fStack_10a0 + fVar209) * fVar178
                              ) * fVar155;
          fVar193 = (fVar181 * (fVar206 + fVar179) - (fStack_10ac + fVar166) * fStack_10bc) *
                    fVar158 + ((fStack_109c + fVar106) * fStack_10bc - (fVar206 + fVar179) * fVar167
                              ) * fVar199 +
                              (fVar167 * (fStack_10ac + fVar166) - (fStack_109c + fVar106) * fVar181
                              ) * fVar155;
          fVar144 = fVar94 - fVar208;
          fVar154 = fVar103 - fVar74;
          fVar156 = fVar209 - fVar75;
          fVar157 = fVar106 - fVar182;
          fVar108 = fVar159 - fVar136;
          fVar125 = fVar189 - fVar142;
          fVar126 = fVar164 - fVar194;
          fVar127 = fVar166 - fVar143;
          fVar201 = fVar168 - fVar195;
          fVar203 = fVar173 - fVar196;
          fVar205 = fVar176 - fVar197;
          fVar207 = fVar179 - fVar198;
          auVar76._0_4_ =
               (fVar108 * (fVar195 + fVar168) - (fVar136 + fVar159) * fVar201) * fVar158 +
               ((fVar208 + fVar94) * fVar201 - (fVar195 + fVar168) * fVar144) * fVar199 +
               (fVar144 * (fVar136 + fVar159) - (fVar208 + fVar94) * fVar108) * fVar155;
          auVar76._4_4_ =
               (fVar125 * (fVar196 + fVar173) - (fVar142 + fVar189) * fVar203) * fVar158 +
               ((fVar74 + fVar103) * fVar203 - (fVar196 + fVar173) * fVar154) * fVar199 +
               (fVar154 * (fVar142 + fVar189) - (fVar74 + fVar103) * fVar125) * fVar155;
          auVar76._8_4_ =
               (fVar126 * (fVar197 + fVar176) - (fVar194 + fVar164) * fVar205) * fVar158 +
               ((fVar75 + fVar209) * fVar205 - (fVar197 + fVar176) * fVar156) * fVar199 +
               (fVar156 * (fVar194 + fVar164) - (fVar75 + fVar209) * fVar126) * fVar155;
          auVar76._12_4_ =
               (fVar127 * (fVar198 + fVar179) - (fVar143 + fVar166) * fVar207) * fVar158 +
               ((fVar182 + fVar106) * fVar207 - (fVar198 + fVar179) * fVar157) * fVar199 +
               (fVar157 * (fVar143 + fVar166) - (fVar182 + fVar106) * fVar127) * fVar155;
          local_10e8._0_4_ = fVar183 + fVar190 + auVar76._0_4_;
          local_10e8._4_4_ = fVar188 + fVar191 + auVar76._4_4_;
          local_10e8._8_4_ = auVar184._8_4_ + fVar192 + auVar76._8_4_;
          local_10e8._12_4_ = auVar184._12_4_ + fVar193 + auVar76._12_4_;
          auVar56._8_4_ = auVar184._8_4_;
          auVar56._0_8_ = auVar184._0_8_;
          auVar56._12_4_ = auVar184._12_4_;
          auVar13._4_4_ = fVar191;
          auVar13._0_4_ = fVar190;
          auVar13._8_4_ = fVar192;
          auVar13._12_4_ = fVar193;
          auVar57 = minps(auVar56,auVar13);
          auVar58 = minps(auVar57,auVar76);
          local_10d8 = auVar184;
          auVar57 = local_10d8;
          auVar14._4_4_ = fVar191;
          auVar14._0_4_ = fVar190;
          auVar14._8_4_ = fVar192;
          auVar14._12_4_ = fVar193;
          auVar47 = maxps(auVar184,auVar14);
          auVar47 = maxps(auVar47,auVar76);
          auVar185._4_4_ = -(uint)(auVar47._4_4_ <= ABS(local_10e8._4_4_) * 1.1920929e-07);
          auVar185._0_4_ = -(uint)(auVar47._0_4_ <= ABS(local_10e8._0_4_) * 1.1920929e-07);
          auVar185._8_4_ = -(uint)(auVar47._8_4_ <= ABS(local_10e8._8_4_) * 1.1920929e-07);
          auVar185._12_4_ = -(uint)(auVar47._12_4_ <= ABS(local_10e8._12_4_) * 1.1920929e-07);
          auVar59._4_4_ = -(uint)(-(ABS(local_10e8._4_4_) * 1.1920929e-07) <= auVar58._4_4_);
          auVar59._0_4_ = -(uint)(-(ABS(local_10e8._0_4_) * 1.1920929e-07) <= auVar58._0_4_);
          auVar59._8_4_ = -(uint)(-(ABS(local_10e8._8_4_) * 1.1920929e-07) <= auVar58._8_4_);
          auVar59._12_4_ = -(uint)(-(ABS(local_10e8._12_4_) * 1.1920929e-07) <= auVar58._12_4_);
          auVar185 = auVar185 | auVar59;
          iVar37 = movmskps((int)&local_1230,auVar185);
          if (iVar37 != 0) {
            auVar140._0_4_ = fVar95 * local_10c8 - fVar170 * fVar210;
            auVar140._4_4_ = fVar104 * fStack_10c4 - fVar175 * fVar211;
            auVar140._8_4_ = fVar105 * fStack_10c0 - fVar178 * fStack_1240;
            auVar140._12_4_ = fVar107 * fStack_10bc - fVar181 * fStack_123c;
            auVar171._0_4_ = fVar170 * fVar201 - fVar108 * local_10c8;
            auVar171._4_4_ = fVar175 * fVar203 - fVar125 * fStack_10c4;
            auVar171._8_4_ = fVar178 * fVar205 - fVar126 * fStack_10c0;
            auVar171._12_4_ = fVar181 * fVar207 - fVar127 * fStack_10bc;
            auVar60._4_4_ = -(uint)(ABS(fVar175 * fVar211) < ABS(fVar125 * fStack_10c4));
            auVar60._0_4_ = -(uint)(ABS(fVar170 * fVar210) < ABS(fVar108 * local_10c8));
            auVar60._8_4_ = -(uint)(ABS(fVar178 * fStack_1240) < ABS(fVar126 * fStack_10c0));
            auVar60._12_4_ = -(uint)(ABS(fVar181 * fStack_123c) < ABS(fVar127 * fStack_10bc));
            local_1168 = blendvps(auVar171,auVar140,auVar60);
            auVar148._0_4_ = fVar144 * local_10c8 - fVar160 * fVar201;
            auVar148._4_4_ = fVar154 * fStack_10c4 - fVar163 * fVar203;
            auVar148._8_4_ = fVar156 * fStack_10c0 - fVar165 * fVar205;
            auVar148._12_4_ = fVar157 * fStack_10bc - fVar167 * fVar207;
            auVar61._4_4_ = -(uint)(ABS(fVar174 * fStack_10c4) < ABS(fVar163 * fVar203));
            auVar61._0_4_ = -(uint)(ABS(fVar169 * local_10c8) < ABS(fVar160 * fVar201));
            auVar61._8_4_ = -(uint)(ABS(fVar177 * fStack_10c0) < ABS(fVar165 * fVar205));
            auVar61._12_4_ = -(uint)(ABS(fVar180 * fStack_10bc) < ABS(fVar167 * fVar207));
            auVar17._4_4_ = fVar211 * fVar163 - fVar174 * fStack_10c4;
            auVar17._0_4_ = fVar210 * fVar160 - fVar169 * local_10c8;
            auVar17._8_4_ = fStack_1240 * fVar165 - fVar177 * fStack_10c0;
            auVar17._12_4_ = fStack_123c * fVar167 - fVar180 * fStack_10bc;
            local_1158 = blendvps(auVar148,auVar17,auVar61);
            auVar131._0_4_ = fVar169 * fVar170 - fVar160 * fVar95;
            auVar131._4_4_ = fVar174 * fVar175 - fVar163 * fVar104;
            auVar131._8_4_ = fVar177 * fVar178 - fVar165 * fVar105;
            auVar131._12_4_ = fVar180 * fVar181 - fVar167 * fVar107;
            auVar161._0_4_ = fVar160 * fVar108 - fVar144 * fVar170;
            auVar161._4_4_ = fVar163 * fVar125 - fVar154 * fVar175;
            auVar161._8_4_ = fVar165 * fVar126 - fVar156 * fVar178;
            auVar161._12_4_ = fVar167 * fVar127 - fVar157 * fVar181;
            auVar62._4_4_ = -(uint)(ABS(fVar163 * fVar104) < ABS(fVar154 * fVar175));
            auVar62._0_4_ = -(uint)(ABS(fVar160 * fVar95) < ABS(fVar144 * fVar170));
            auVar62._8_4_ = -(uint)(ABS(fVar165 * fVar105) < ABS(fVar156 * fVar178));
            auVar62._12_4_ = -(uint)(ABS(fVar167 * fVar107) < ABS(fVar157 * fVar181));
            local_1148 = blendvps(auVar161,auVar131,auVar62);
            fVar103 = fVar158 * local_1168._0_4_ +
                      fVar199 * local_1158._0_4_ + fVar155 * local_1148._0_4_;
            fVar75 = fVar158 * local_1168._4_4_ +
                     fVar199 * local_1158._4_4_ + fVar155 * local_1148._4_4_;
            fVar106 = fVar158 * local_1168._8_4_ +
                      fVar199 * local_1158._8_4_ + fVar155 * local_1148._8_4_;
            fVar182 = fVar158 * local_1168._12_4_ +
                      fVar199 * local_1158._12_4_ + fVar155 * local_1148._12_4_;
            auVar113._0_4_ = fVar103 + fVar103;
            auVar113._4_4_ = fVar75 + fVar75;
            auVar113._8_4_ = fVar106 + fVar106;
            auVar113._12_4_ = fVar182 + fVar182;
            auVar77._0_4_ = local_10b8 * local_1158._0_4_ + fVar200 * local_1148._0_4_;
            auVar77._4_4_ = fStack_10b4 * local_1158._4_4_ + fVar202 * local_1148._4_4_;
            auVar77._8_4_ = fStack_10b0 * local_1158._8_4_ + fVar204 * local_1148._8_4_;
            auVar77._12_4_ = fStack_10ac * local_1158._12_4_ + fVar206 * local_1148._12_4_;
            fVar189 = local_10a8 * local_1168._0_4_ + auVar77._0_4_;
            fVar194 = fStack_10a4 * local_1168._4_4_ + auVar77._4_4_;
            fVar166 = fStack_10a0 * local_1168._8_4_ + auVar77._8_4_;
            fVar143 = fStack_109c * local_1168._12_4_ + auVar77._12_4_;
            auVar58 = rcpps(auVar77,auVar113);
            fVar103 = auVar58._0_4_;
            fVar75 = auVar58._4_4_;
            fVar106 = auVar58._8_4_;
            fVar182 = auVar58._12_4_;
            local_1178[0] =
                 ((1.0 - auVar113._0_4_ * fVar103) * fVar103 + fVar103) * (fVar189 + fVar189);
            local_1178[1] =
                 ((1.0 - auVar113._4_4_ * fVar75) * fVar75 + fVar75) * (fVar194 + fVar194);
            local_1178[2] =
                 ((1.0 - auVar113._8_4_ * fVar106) * fVar106 + fVar106) * (fVar166 + fVar166);
            local_1178[3] =
                 ((1.0 - auVar113._12_4_ * fVar182) * fVar182 + fVar182) * (fVar143 + fVar143);
            fVar103 = *(float *)(ray + k * 4 + 0x80);
            fVar75 = *(float *)(ray + k * 4 + 0x30);
            auVar78._0_4_ =
                 -(uint)(local_1178[0] <= fVar103 && fVar75 <= local_1178[0]) & auVar185._0_4_;
            auVar78._4_4_ =
                 -(uint)(local_1178[1] <= fVar103 && fVar75 <= local_1178[1]) & auVar185._4_4_;
            auVar78._8_4_ =
                 -(uint)(local_1178[2] <= fVar103 && fVar75 <= local_1178[2]) & auVar185._8_4_;
            auVar78._12_4_ =
                 -(uint)(local_1178[3] <= fVar103 && fVar75 <= local_1178[3]) & auVar185._12_4_;
            iVar37 = movmskps(iVar37,auVar78);
            if (iVar37 != 0) {
              auVar114._4_4_ = -(uint)(auVar113._4_4_ != 0.0);
              auVar114._0_4_ = -(uint)(auVar113._0_4_ != 0.0);
              auVar114._8_4_ = -(uint)(auVar113._8_4_ != 0.0);
              auVar114._12_4_ = -(uint)(auVar113._12_4_ != 0.0);
              valid.field_0.i[0] = auVar78._0_4_ & -(uint)(auVar113._0_4_ != 0.0);
              valid.field_0.i[1] = auVar78._4_4_ & -(uint)(auVar113._4_4_ != 0.0);
              valid.field_0.i[2] = auVar78._8_4_ & -(uint)(auVar113._8_4_ != 0.0);
              valid.field_0.i[3] = auVar78._12_4_ & -(uint)(auVar113._12_4_ != 0.0);
              iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
              if (iVar37 != 0) {
                local_10d8._8_8_ = auVar184._8_8_;
                tNear.field_0._8_8_ = local_10d8._8_8_;
                tNear.field_0._0_8_ = auVar184._0_8_;
                pGVar11 = (context->scene->geometries).items[uVar7].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar58 = rcpps(auVar114,local_10e8);
                  fVar103 = auVar58._0_4_;
                  fVar75 = auVar58._4_4_;
                  fVar106 = auVar58._8_4_;
                  fVar182 = auVar58._12_4_;
                  fVar103 = (float)(-(uint)(1e-18 <= ABS(local_10e8._0_4_)) &
                                   (uint)(((float)DAT_01feca10 - local_10e8._0_4_ * fVar103) *
                                          fVar103 + fVar103));
                  fVar75 = (float)(-(uint)(1e-18 <= ABS(local_10e8._4_4_)) &
                                  (uint)((DAT_01feca10._4_4_ - local_10e8._4_4_ * fVar75) * fVar75 +
                                        fVar75));
                  fVar106 = (float)(-(uint)(1e-18 <= ABS(local_10e8._8_4_)) &
                                   (uint)((DAT_01feca10._8_4_ - local_10e8._8_4_ * fVar106) *
                                          fVar106 + fVar106));
                  fVar182 = (float)(-(uint)(1e-18 <= ABS(local_10e8._12_4_)) &
                                   (uint)((DAT_01feca10._12_4_ - local_10e8._12_4_ * fVar182) *
                                          fVar182 + fVar182));
                  auVar100._0_4_ = fVar183 * fVar103;
                  auVar100._4_4_ = fVar188 * fVar75;
                  auVar100._8_4_ = auVar184._8_4_ * fVar106;
                  auVar100._12_4_ = auVar184._12_4_ * fVar182;
                  auVar101 = minps(auVar100,_DAT_01feca10);
                  auVar79._0_4_ = fVar103 * fVar190;
                  auVar79._4_4_ = fVar75 * fVar191;
                  auVar79._8_4_ = fVar106 * fVar192;
                  auVar79._12_4_ = fVar182 * fVar193;
                  auVar96 = minps(auVar79,_DAT_01feca10);
                  auVar58 = *(undefined1 (*) [16])local_1230;
                  auVar145 = auVar58._0_12_;
                  auVar47 = *(undefined1 (*) [16])(local_1230 + uVar27 * 4);
                  auVar128 = auVar47._0_12_;
                  if (uVar27 == 2) {
                    auVar145._0_8_ = auVar58._0_8_;
                    auVar145._8_4_ = auVar58._4_4_;
                    auVar128._0_8_ = auVar47._0_8_;
                    auVar128._8_4_ = auVar47._4_4_;
                  }
                  auVar149._4_4_ = auVar145._4_4_;
                  auVar149._8_4_ = auVar145._8_4_;
                  auVar116._0_8_ = auVar145._0_8_;
                  auVar116._8_4_ = auVar149._4_4_;
                  uVar135 = auVar128._4_4_;
                  auVar116._12_4_ = uVar135;
                  auVar115._8_8_ = auVar116._8_8_;
                  auVar115._0_4_ = auVar145._0_4_;
                  uVar38 = auVar128._0_4_;
                  auVar115._4_4_ = uVar38;
                  auVar149._0_4_ = auVar149._4_4_;
                  auVar149._12_4_ = auVar149._8_4_;
                  auVar132._0_8_ = auVar128._0_8_;
                  auVar132._8_4_ = uVar135;
                  auVar132._12_4_ = auVar128._8_4_;
                  auVar47 = ZEXT816(0);
                  auVar58 = pblendw(auVar115,auVar47,0xaa);
                  auVar150 = pblendw(auVar149,auVar47,0xaa);
                  auVar47 = pblendw(auVar132,auVar47,0xaa);
                  fVar189 = auVar101._0_4_;
                  fVar194 = auVar101._4_4_;
                  fVar166 = auVar101._8_4_;
                  fVar143 = auVar101._12_4_;
                  fVar103 = auVar96._0_4_;
                  fVar75 = auVar96._4_4_;
                  fVar106 = auVar96._8_4_;
                  fVar182 = auVar96._12_4_;
                  fVar173 = (1.0 - fVar189) - fVar103;
                  fVar197 = (1.0 - fVar194) - fVar75;
                  fVar198 = (1.0 - fVar166) - fVar106;
                  fVar179 = (1.0 - fVar143) - fVar182;
                  local_1198[1] =
                       (float)auVar58._4_4_ * 0.00012207031 * fVar197 +
                       (float)auVar47._4_4_ * 0.00012207031 * fVar75 +
                       (float)auVar150._4_4_ * 0.00012207031 * fVar194;
                  local_1198[0] =
                       (float)auVar58._0_4_ * 0.00012207031 * fVar173 +
                       (float)auVar47._0_4_ * 0.00012207031 * fVar103 +
                       (float)auVar150._0_4_ * 0.00012207031 * fVar189;
                  local_1198[2] =
                       (float)auVar58._8_4_ * 0.00012207031 * fVar198 +
                       (float)auVar47._8_4_ * 0.00012207031 * fVar106 +
                       (float)auVar150._8_4_ * 0.00012207031 * fVar166;
                  local_1198[3] =
                       (float)auVar58._12_4_ * 0.00012207031 * fVar179 +
                       (float)auVar47._12_4_ * 0.00012207031 * fVar182 +
                       (float)auVar150._12_4_ * 0.00012207031 * fVar143;
                  local_1188[1] =
                       fVar197 * (float)(uVar38 >> 0x10) * 0.00012207031 +
                       (float)(uVar135 >> 0x10) * 0.00012207031 * fVar75 +
                       (float)(auVar149._4_4_ >> 0x10) * 0.00012207031 * fVar194;
                  local_1188[0] =
                       fVar173 * (float)(auVar115._0_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar38 >> 0x10) * 0.00012207031 * fVar103 +
                       (float)(auVar149._4_4_ >> 0x10) * 0.00012207031 * fVar189;
                  local_1188[2] =
                       fVar198 * (float)(auVar149._4_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar135 >> 0x10) * 0.00012207031 * fVar106 +
                       (float)(auVar149._8_4_ >> 0x10) * 0.00012207031 * fVar166;
                  local_1188[3] =
                       fVar179 * (float)(uVar135 >> 0x10) * 0.00012207031 +
                       (float)(auVar128._8_4_ >> 0x10) * 0.00012207031 * fVar182 +
                       (float)(auVar149._8_4_ >> 0x10) * 0.00012207031 * fVar143;
                  auVar153._4_4_ = local_1178[1];
                  auVar153._0_4_ = local_1178[0];
                  auVar153._8_4_ = local_1178[2];
                  auVar153._12_4_ = local_1178[3];
                  auVar47 = blendvps(_DAT_01feb9f0,auVar153,(undefined1  [16])valid.field_0);
                  auVar117._4_4_ = auVar47._0_4_;
                  auVar117._0_4_ = auVar47._4_4_;
                  auVar117._8_4_ = auVar47._12_4_;
                  auVar117._12_4_ = auVar47._8_4_;
                  auVar58 = minps(auVar117,auVar47);
                  auVar80._0_8_ = auVar58._8_8_;
                  auVar80._8_4_ = auVar58._0_4_;
                  auVar80._12_4_ = auVar58._4_4_;
                  auVar58 = minps(auVar80,auVar58);
                  auVar81._0_8_ =
                       CONCAT44(-(uint)(auVar58._4_4_ == auVar47._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar58._0_4_ == auVar47._0_4_) & valid.field_0.i[0]);
                  auVar81._8_4_ = -(uint)(auVar58._8_4_ == auVar47._8_4_) & valid.field_0.i[2];
                  auVar81._12_4_ = -(uint)(auVar58._12_4_ == auVar47._12_4_) & valid.field_0.i[3];
                  iVar37 = movmskps(uVar39,auVar81);
                  aVar63 = valid.field_0;
                  if (iVar37 != 0) {
                    aVar63.i[2] = auVar81._8_4_;
                    aVar63._0_8_ = auVar81._0_8_;
                    aVar63.i[3] = auVar81._12_4_;
                  }
                  uVar38 = movmskps(iVar37,(undefined1  [16])aVar63);
                  lVar45 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar103 = local_1198[lVar45];
                    fVar75 = local_1188[lVar45];
                    uVar40 = *(undefined4 *)(local_1168 + lVar45 * 4);
                    uVar5 = *(undefined4 *)(local_1158 + lVar45 * 4);
                    uVar6 = *(undefined4 *)(local_1148 + lVar45 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_1178[lVar45];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar40;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar6;
                    *(float *)(ray + k * 4 + 0xf0) = fVar103;
                    *(float *)(ray + k * 4 + 0x100) = fVar75;
                    *(undefined4 *)(ray + k * 4 + 0x110) = (undefined4)uStack_1280;
                    *(uint *)(ray + k * 4 + 0x120) = uVar7;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    uVar44 = local_1118;
                  }
                  else {
                    local_12a8 = CONCAT44(uVar7,uVar7);
                    uStack_12a0 = CONCAT44(uVar7,uVar7);
                    local_1288 = CONCAT44((undefined4)uStack_1280,(undefined4)uStack_1280);
                    uStack_1280._4_4_ = (undefined4)uStack_1280;
                    local_1138 = *local_1120;
                    uStack_1130 = local_1120[1];
                    _local_1258 = auVar153;
                    local_1248 = uVar41;
                    local_1228 = uVar27;
                    local_1220 = uVar41;
                    local_10d8 = auVar57;
                    do {
                      uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_fd8 = local_1198[lVar45];
                      fVar103 = local_1188[lVar45];
                      *(float *)(ray + k * 4 + 0x80) = local_1178[lVar45];
                      args.context = context->user;
                      local_fc8._4_4_ = fVar103;
                      local_fc8._0_4_ = fVar103;
                      local_fc8._8_4_ = fVar103;
                      local_fc8._12_4_ = fVar103;
                      local_1008 = *(undefined4 *)(local_1168 + lVar45 * 4);
                      uVar5 = *(undefined4 *)(local_1158 + lVar45 * 4);
                      local_fe8 = *(undefined4 *)(local_1148 + lVar45 * 4);
                      local_ff8._4_4_ = uVar5;
                      local_ff8._0_4_ = uVar5;
                      local_ff8._8_4_ = uVar5;
                      local_ff8._12_4_ = uVar5;
                      uStack_1004 = local_1008;
                      uStack_1000 = local_1008;
                      uStack_ffc = local_1008;
                      uStack_fe4 = local_fe8;
                      uStack_fe0 = local_fe8;
                      uStack_fdc = local_fe8;
                      fStack_fd4 = local_fd8;
                      fStack_fd0 = local_fd8;
                      fStack_fcc = local_fd8;
                      local_fb8 = local_1288;
                      uStack_fb0 = uStack_1280;
                      local_fa8 = local_12a8;
                      uStack_fa0 = uStack_12a0;
                      local_f98 = (args.context)->instID[0];
                      uStack_f94 = local_f98;
                      uStack_f90 = local_f98;
                      uStack_f8c = local_f98;
                      local_f88 = (args.context)->instPrimID[0];
                      uStack_f84 = local_f88;
                      uStack_f80 = local_f88;
                      uStack_f7c = local_f88;
                      local_1268 = local_1138;
                      uStack_1260 = uStack_1130;
                      args.valid = (int *)&local_1268;
                      pGVar35 = (Geometry *)pGVar11->userPtr;
                      args.hit = (RTCHitN *)&local_1008;
                      args.N = 4;
                      pDVar30 = (Device *)pGVar11->intersectionFilterN;
                      args.geometryUserPtr = pGVar35;
                      args.ray = (RTCRayN *)ray;
                      if (pDVar30 != (Device *)0x0) {
                        pDVar30 = (Device *)(*(code *)pDVar30)(&args);
                        uVar41 = local_1248;
                        auVar153 = _local_1258;
                      }
                      auVar20._8_8_ = uStack_1260;
                      auVar20._0_8_ = local_1268;
                      if (auVar20 == (undefined1  [16])0x0) {
                        auVar88._8_4_ = 0xffffffff;
                        auVar88._0_8_ = 0xffffffffffffffff;
                        auVar88._12_4_ = 0xffffffff;
                        auVar88 = auVar88 ^ _DAT_01febe20;
                      }
                      else {
                        pGVar35 = (Geometry *)context->args;
                        pDVar30 = pGVar35->device;
                        if ((pDVar30 != (Device *)0x0) &&
                           ((((ulong)(pGVar35->super_RefCount)._vptr_RefCount & 2) != 0 ||
                            (pGVar35 = pGVar11, ((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          pDVar30 = (Device *)(*(code *)pDVar30)(&args);
                          uVar41 = local_1248;
                          auVar153 = _local_1258;
                        }
                        auVar21._8_8_ = uStack_1260;
                        auVar21._0_8_ = local_1268;
                        auVar70._0_4_ = -(uint)((int)local_1268 == 0);
                        auVar70._4_4_ = -(uint)((int)((ulong)local_1268 >> 0x20) == 0);
                        auVar70._8_4_ = -(uint)((int)uStack_1260 == 0);
                        auVar70._12_4_ = -(uint)((int)((ulong)uStack_1260 >> 0x20) == 0);
                        auVar88 = auVar70 ^ _DAT_01febe20;
                        if (auVar21 != (undefined1  [16])0x0) {
                          auVar57 = blendvps(*(undefined1 (*) [16])args.hit,
                                             *(undefined1 (*) [16])(args.ray + 0xc0),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                             *(undefined1 (*) [16])(args.ray + 0xd0),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0xd0) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                             *(undefined1 (*) [16])(args.ray + 0xe0),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                             *(undefined1 (*) [16])(args.ray + 0xf0),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                             *(undefined1 (*) [16])(args.ray + 0x100),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0x100) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                             *(undefined1 (*) [16])(args.ray + 0x110),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0x110) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                             *(undefined1 (*) [16])(args.ray + 0x120),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0x120) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                             *(undefined1 (*) [16])(args.ray + 0x130),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar57;
                          auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                             *(undefined1 (*) [16])(args.ray + 0x140),auVar70);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar57;
                          pDVar30 = (Device *)args.ray;
                          pGVar35 = (Geometry *)args.hit;
                        }
                      }
                      if ((_DAT_01fecb20 & auVar88) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar40;
                      }
                      valid.field_0.v[lVar45] = 0.0;
                      fVar103 = *(float *)(ray + k * 4 + 0x80);
                      valid.field_0.i[0] = -(uint)(auVar153._0_4_ <= fVar103) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(auVar153._4_4_ <= fVar103) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(auVar153._8_4_ <= fVar103) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(auVar153._12_4_ <= fVar103) & valid.field_0.i[3];
                      iVar37 = movmskps((int)pDVar30,(undefined1  [16])valid.field_0);
                      if (iVar37 != 0) {
                        auVar58 = blendvps(_DAT_01feb9f0,auVar153,(undefined1  [16])valid.field_0);
                        auVar123._4_4_ = auVar58._0_4_;
                        auVar123._0_4_ = auVar58._4_4_;
                        auVar123._8_4_ = auVar58._12_4_;
                        auVar123._12_4_ = auVar58._8_4_;
                        auVar57 = minps(auVar123,auVar58);
                        auVar89._0_8_ = auVar57._8_8_;
                        auVar89._8_4_ = auVar57._0_4_;
                        auVar89._12_4_ = auVar57._4_4_;
                        auVar57 = minps(auVar89,auVar57);
                        auVar90._0_8_ =
                             CONCAT44(-(uint)(auVar57._4_4_ == auVar58._4_4_) & valid.field_0.i[1],
                                      -(uint)(auVar57._0_4_ == auVar58._0_4_) & valid.field_0.i[0]);
                        auVar90._8_4_ = -(uint)(auVar57._8_4_ == auVar58._8_4_) & valid.field_0.i[2]
                        ;
                        auVar90._12_4_ =
                             -(uint)(auVar57._12_4_ == auVar58._12_4_) & valid.field_0.i[3];
                        iVar33 = movmskps((int)pGVar35,auVar90);
                        aVar71 = valid.field_0;
                        if (iVar33 != 0) {
                          aVar71.i[2] = auVar90._8_4_;
                          aVar71._0_8_ = auVar90._0_8_;
                          aVar71.i[3] = auVar90._12_4_;
                        }
                        uVar40 = movmskps(iVar33,(undefined1  [16])aVar71);
                        uVar44 = CONCAT44((int)((ulong)pGVar35 >> 0x20),uVar40);
                        lVar45 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                          }
                        }
                      }
                      uVar44 = local_1118;
                    } while ((char)iVar37 != '\0');
                  }
                }
              }
            }
          }
          if ((uint)uVar41 < 3) {
            sVar34 = 0;
            auVar57 = local_10f8;
            fVar189 = local_1048;
            fVar166 = fStack_1044;
            fVar143 = fStack_1040;
            fVar173 = fStack_103c;
            fVar194 = local_1058;
            fVar197 = fStack_1054;
            fVar198 = fStack_1050;
            fVar179 = fStack_104c;
            fVar199 = local_1068;
            fVar155 = fStack_1064;
            fVar95 = fStack_1060;
            fVar158 = fStack_105c;
            fVar208 = local_1078;
            fVar74 = fStack_1074;
            fVar94 = fStack_1070;
            fVar104 = fStack_106c;
            fVar209 = local_1088;
            fVar105 = fStack_1084;
            fVar107 = fStack_1080;
            fVar108 = fStack_107c;
            fVar103 = local_1108;
            fVar125 = fStack_1104;
            fVar126 = fStack_1100;
            fVar127 = fStack_10fc;
            fVar75 = local_1018;
            fVar136 = fStack_1014;
            fVar142 = fStack_1010;
            fVar144 = fStack_100c;
            fVar106 = local_1028;
            fVar154 = fStack_1024;
            fVar156 = fStack_1020;
            fVar157 = fStack_101c;
            fVar182 = local_1038;
            fVar159 = fStack_1034;
            fVar160 = fStack_1030;
            fVar163 = fStack_102c;
          }
          else {
            lVar46 = uVar27 * 4 + lVar46;
            pGVar29 = pGVar10 + lVar46 + 0x2c;
            fVar103 = *(float *)(pGVar10 + lVar46 + 0x30);
            pGVar32 = pGVar29 + uVar27 * 4;
            fVar75 = *(float *)(pGVar32 + 4);
            fVar106 = *(float *)(pGVar10 + lVar46 + 0x34);
            fVar182 = *(float *)(pGVar32 + 8);
            if (uVar27 == 2) {
              fVar106 = fVar103;
              fVar182 = fVar75;
            }
            pGVar12 = (pre->super_Precalculations).grid;
            uVar28 = (ulong)*(uint *)(pGVar12 + 0x14);
            pGVar10 = pGVar29 + uVar28 * 4;
            fVar189 = *(float *)(pGVar10 + 4);
            pGVar1 = pGVar10 + uVar27 * 4;
            fVar194 = *(float *)(pGVar1 + 4);
            fVar166 = *(float *)(pGVar10 + 8);
            fVar143 = *(float *)(pGVar1 + 8);
            if (uVar27 == 2) {
              fVar166 = fVar189;
              fVar143 = fVar194;
            }
            pGVar2 = pGVar29 + uVar28 * 8;
            fVar173 = *(float *)(pGVar2 + 4);
            pGVar3 = pGVar2 + uVar27 * 4;
            fVar197 = *(float *)(pGVar3 + 4);
            fVar198 = *(float *)(pGVar3 + 8);
            fVar179 = *(float *)(pGVar2 + 8);
            if (uVar27 == 2) {
              fVar198 = fVar197;
              fVar179 = fVar173;
            }
            local_1230 = pGVar29 + uVar28 * 0xc;
            uVar7 = *(uint *)(pGVar12 + 0x18);
            uStack_12c0._0_4_ = *(undefined4 *)(pGVar12 + 0x1c);
            fVar199 = *(float *)(ray + k * 4);
            fVar155 = *(float *)(ray + k * 4 + 0x10);
            fVar95 = *(float *)(ray + k * 4 + 0x20);
            fVar158 = *(float *)(ray + k * 4 + 0x40);
            local_10a8 = *(float *)pGVar29 - fVar199;
            fStack_10a4 = *(float *)pGVar32 - fVar199;
            fStack_10a0 = fVar103 - fVar199;
            fStack_109c = fVar75 - fVar199;
            local_10b8 = *(float *)pGVar10 - fVar155;
            fStack_10b4 = *(float *)pGVar1 - fVar155;
            fStack_10b0 = fVar189 - fVar155;
            fStack_10ac = fVar194 - fVar155;
            fVar192 = *(float *)pGVar2 - fVar95;
            fVar195 = *(float *)pGVar3 - fVar95;
            fVar200 = fVar173 - fVar95;
            fVar202 = fVar197 - fVar95;
            fVar94 = fVar103 - fVar199;
            fVar103 = fVar103 - fVar199;
            fVar104 = fVar106 - fVar199;
            fVar106 = fVar106 - fVar199;
            fVar144 = fVar189 - fVar155;
            fVar189 = fVar189 - fVar155;
            fVar157 = fVar166 - fVar155;
            fVar166 = fVar166 - fVar155;
            fVar163 = fVar173 - fVar95;
            fVar173 = fVar173 - fVar95;
            fVar169 = fVar179 - fVar95;
            fVar179 = fVar179 - fVar95;
            fVar208 = *(float *)pGVar32 - fVar199;
            fVar74 = fVar75 - fVar199;
            fVar75 = fVar75 - fVar199;
            fVar182 = fVar182 - fVar199;
            fVar108 = *(float *)pGVar1 - fVar155;
            fVar125 = fVar194 - fVar155;
            fVar194 = fVar194 - fVar155;
            fVar143 = fVar143 - fVar155;
            fVar190 = *(float *)pGVar3 - fVar95;
            fVar191 = fVar197 - fVar95;
            fVar197 = fVar197 - fVar95;
            fVar198 = fVar198 - fVar95;
            fVar164 = fVar208 - local_10a8;
            fVar167 = fVar74 - fStack_10a4;
            fVar170 = fVar75 - fStack_10a0;
            fVar175 = fVar182 - fStack_109c;
            local_1258._0_4_ = fVar108 - local_10b8;
            local_1258._4_4_ = fVar125 - fStack_10b4;
            fStack_1250 = fVar194 - fStack_10b0;
            fStack_124c = fVar143 - fStack_10ac;
            fVar204 = fVar190 - fVar192;
            fVar205 = fVar191 - fVar195;
            fStack_1240 = fVar197 - fVar200;
            fStack_123c = fVar198 - fVar202;
            local_1138 = CONCAT44(fVar167,fVar164);
            uStack_1130 = CONCAT44(fVar175,fVar170);
            local_1248 = CONCAT44(fVar205,fVar204);
            fVar199 = *(float *)(ray + k * 4 + 0x50);
            fVar155 = *(float *)(ray + k * 4 + 0x60);
            fVar154 = local_10a8 - fVar94;
            fVar156 = fStack_10a4 - fVar103;
            fVar159 = fStack_10a0 - fVar104;
            fVar160 = fStack_109c - fVar106;
            fVar177 = ((float)local_1258._0_4_ * (fVar190 + fVar192) -
                      (fVar108 + local_10b8) * fVar204) * fVar158 +
                      ((fVar208 + local_10a8) * fVar204 - (fVar190 + fVar192) * fVar164) * fVar199 +
                      (fVar164 * (fVar108 + local_10b8) -
                      (fVar208 + local_10a8) * (float)local_1258._0_4_) * fVar155;
            fVar178 = ((float)local_1258._4_4_ * (fVar191 + fVar195) -
                      (fVar125 + fStack_10b4) * fVar205) * fVar158 +
                      ((fVar74 + fStack_10a4) * fVar205 - (fVar191 + fVar195) * fVar167) * fVar199 +
                      (fVar167 * (fVar125 + fStack_10b4) -
                      (fVar74 + fStack_10a4) * (float)local_1258._4_4_) * fVar155;
            auVar186._0_8_ = CONCAT44(fVar178,fVar177);
            auVar186._8_4_ =
                 (fStack_1250 * (fVar197 + fVar200) - (fVar194 + fStack_10b0) * fStack_1240) *
                 fVar158 + ((fVar75 + fStack_10a0) * fStack_1240 - (fVar197 + fVar200) * fVar170) *
                           fVar199 + (fVar170 * (fVar194 + fStack_10b0) -
                                     (fVar75 + fStack_10a0) * fStack_1250) * fVar155;
            auVar186._12_4_ =
                 (fStack_124c * (fVar198 + fVar202) - (fVar143 + fStack_10ac) * fStack_123c) *
                 fVar158 + ((fVar182 + fStack_109c) * fStack_123c - (fVar198 + fVar202) * fVar175) *
                           fVar199 + (fVar175 * (fVar143 + fStack_10ac) -
                                     (fVar182 + fStack_109c) * fStack_124c) * fVar155;
            fVar165 = local_10b8 - fVar144;
            fVar168 = fStack_10b4 - fVar189;
            fVar174 = fStack_10b0 - fVar157;
            fVar176 = fStack_10ac - fVar166;
            local_10c8 = fVar192 - fVar163;
            fStack_10c4 = fVar195 - fVar173;
            fStack_10c0 = fVar200 - fVar169;
            fStack_10bc = fVar202 - fVar179;
            fVar180 = (fVar165 * (fVar192 + fVar163) - (local_10b8 + fVar144) * local_10c8) *
                      fVar158 + ((local_10a8 + fVar94) * local_10c8 - (fVar192 + fVar163) * fVar154)
                                * fVar199 +
                                (fVar154 * (local_10b8 + fVar144) - (local_10a8 + fVar94) * fVar165)
                                * fVar155;
            fVar181 = (fVar168 * (fVar195 + fVar173) - (fStack_10b4 + fVar189) * fStack_10c4) *
                      fVar158 + ((fStack_10a4 + fVar103) * fStack_10c4 -
                                (fVar195 + fVar173) * fVar156) * fVar199 +
                                (fVar156 * (fStack_10b4 + fVar189) -
                                (fStack_10a4 + fVar103) * fVar168) * fVar155;
            fVar183 = (fVar174 * (fVar200 + fVar169) - (fStack_10b0 + fVar157) * fStack_10c0) *
                      fVar158 + ((fStack_10a0 + fVar104) * fStack_10c0 -
                                (fVar200 + fVar169) * fVar159) * fVar199 +
                                (fVar159 * (fStack_10b0 + fVar157) -
                                (fStack_10a0 + fVar104) * fVar174) * fVar155;
            fVar188 = (fVar176 * (fVar202 + fVar179) - (fStack_10ac + fVar166) * fStack_10bc) *
                      fVar158 + ((fStack_109c + fVar106) * fStack_10bc -
                                (fVar202 + fVar179) * fVar160) * fVar199 +
                                (fVar160 * (fStack_10ac + fVar166) -
                                (fStack_109c + fVar106) * fVar176) * fVar155;
            fVar126 = fVar94 - fVar208;
            fVar127 = fVar103 - fVar74;
            fVar136 = fVar104 - fVar75;
            fVar142 = fVar106 - fVar182;
            fVar95 = fVar144 - fVar108;
            fVar209 = fVar189 - fVar125;
            fVar105 = fVar157 - fVar194;
            fVar107 = fVar166 - fVar143;
            fVar193 = fVar163 - fVar190;
            fVar196 = fVar173 - fVar191;
            fVar201 = fVar169 - fVar197;
            fVar203 = fVar179 - fVar198;
            auVar82._0_4_ =
                 (fVar95 * (fVar190 + fVar163) - (fVar108 + fVar144) * fVar193) * fVar158 +
                 ((fVar208 + fVar94) * fVar193 - (fVar190 + fVar163) * fVar126) * fVar199 +
                 (fVar126 * (fVar108 + fVar144) - (fVar208 + fVar94) * fVar95) * fVar155;
            auVar82._4_4_ =
                 (fVar209 * (fVar191 + fVar173) - (fVar125 + fVar189) * fVar196) * fVar158 +
                 ((fVar74 + fVar103) * fVar196 - (fVar191 + fVar173) * fVar127) * fVar199 +
                 (fVar127 * (fVar125 + fVar189) - (fVar74 + fVar103) * fVar209) * fVar155;
            auVar82._8_4_ =
                 (fVar105 * (fVar197 + fVar169) - (fVar194 + fVar157) * fVar201) * fVar158 +
                 ((fVar75 + fVar104) * fVar201 - (fVar197 + fVar169) * fVar136) * fVar199 +
                 (fVar136 * (fVar194 + fVar157) - (fVar75 + fVar104) * fVar105) * fVar155;
            auVar82._12_4_ =
                 (fVar107 * (fVar198 + fVar179) - (fVar143 + fVar166) * fVar203) * fVar158 +
                 ((fVar182 + fVar106) * fVar203 - (fVar198 + fVar179) * fVar142) * fVar199 +
                 (fVar142 * (fVar143 + fVar166) - (fVar182 + fVar106) * fVar107) * fVar155;
            local_10e8._0_4_ = fVar177 + fVar180 + auVar82._0_4_;
            local_10e8._4_4_ = fVar178 + fVar181 + auVar82._4_4_;
            local_10e8._8_4_ = auVar186._8_4_ + fVar183 + auVar82._8_4_;
            local_10e8._12_4_ = auVar186._12_4_ + fVar188 + auVar82._12_4_;
            auVar64._8_4_ = auVar186._8_4_;
            auVar64._0_8_ = auVar186._0_8_;
            auVar64._12_4_ = auVar186._12_4_;
            auVar15._4_4_ = fVar181;
            auVar15._0_4_ = fVar180;
            auVar15._8_4_ = fVar183;
            auVar15._12_4_ = fVar188;
            auVar57 = minps(auVar64,auVar15);
            auVar58 = minps(auVar57,auVar82);
            local_10d8 = auVar186;
            auVar57 = local_10d8;
            auVar16._4_4_ = fVar181;
            auVar16._0_4_ = fVar180;
            auVar16._8_4_ = fVar183;
            auVar16._12_4_ = fVar188;
            auVar47 = maxps(auVar186,auVar16);
            auVar47 = maxps(auVar47,auVar82);
            auVar187._4_4_ = -(uint)(auVar47._4_4_ <= ABS(local_10e8._4_4_) * 1.1920929e-07);
            auVar187._0_4_ = -(uint)(auVar47._0_4_ <= ABS(local_10e8._0_4_) * 1.1920929e-07);
            auVar187._8_4_ = -(uint)(auVar47._8_4_ <= ABS(local_10e8._8_4_) * 1.1920929e-07);
            auVar187._12_4_ = -(uint)(auVar47._12_4_ <= ABS(local_10e8._12_4_) * 1.1920929e-07);
            auVar65._4_4_ = -(uint)(-(ABS(local_10e8._4_4_) * 1.1920929e-07) <= auVar58._4_4_);
            auVar65._0_4_ = -(uint)(-(ABS(local_10e8._0_4_) * 1.1920929e-07) <= auVar58._0_4_);
            auVar65._8_4_ = -(uint)(-(ABS(local_10e8._8_4_) * 1.1920929e-07) <= auVar58._8_4_);
            auVar65._12_4_ = -(uint)(-(ABS(local_10e8._12_4_) * 1.1920929e-07) <= auVar58._12_4_);
            auVar187 = auVar187 | auVar65;
            iVar37 = movmskps((int)&local_1230,auVar187);
            if (iVar37 != 0) {
              auVar141._0_4_ = (float)local_1258._0_4_ * local_10c8 - fVar165 * fVar204;
              auVar141._4_4_ = (float)local_1258._4_4_ * fStack_10c4 - fVar168 * fVar205;
              auVar141._8_4_ = fStack_1250 * fStack_10c0 - fVar174 * fStack_1240;
              auVar141._12_4_ = fStack_124c * fStack_10bc - fVar176 * fStack_123c;
              auVar172._0_4_ = fVar165 * fVar193 - fVar95 * local_10c8;
              auVar172._4_4_ = fVar168 * fVar196 - fVar209 * fStack_10c4;
              auVar172._8_4_ = fVar174 * fVar201 - fVar105 * fStack_10c0;
              auVar172._12_4_ = fVar176 * fVar203 - fVar107 * fStack_10bc;
              auVar66._4_4_ = -(uint)(ABS(fVar168 * fVar205) < ABS(fVar209 * fStack_10c4));
              auVar66._0_4_ = -(uint)(ABS(fVar165 * fVar204) < ABS(fVar95 * local_10c8));
              auVar66._8_4_ = -(uint)(ABS(fVar174 * fStack_1240) < ABS(fVar105 * fStack_10c0));
              auVar66._12_4_ = -(uint)(ABS(fVar176 * fStack_123c) < ABS(fVar107 * fStack_10bc));
              local_1168 = blendvps(auVar172,auVar141,auVar66);
              auVar151._0_4_ = fVar126 * local_10c8 - fVar154 * fVar193;
              auVar151._4_4_ = fVar127 * fStack_10c4 - fVar156 * fVar196;
              auVar151._8_4_ = fVar136 * fStack_10c0 - fVar159 * fVar201;
              auVar151._12_4_ = fVar142 * fStack_10bc - fVar160 * fVar203;
              auVar67._4_4_ = -(uint)(ABS(fVar167 * fStack_10c4) < ABS(fVar156 * fVar196));
              auVar67._0_4_ = -(uint)(ABS(fVar164 * local_10c8) < ABS(fVar154 * fVar193));
              auVar67._8_4_ = -(uint)(ABS(fVar170 * fStack_10c0) < ABS(fVar159 * fVar201));
              auVar67._12_4_ = -(uint)(ABS(fVar175 * fStack_10bc) < ABS(fVar160 * fVar203));
              auVar18._4_4_ = fVar205 * fVar156 - fVar167 * fStack_10c4;
              auVar18._0_4_ = fVar204 * fVar154 - fVar164 * local_10c8;
              auVar18._8_4_ = fStack_1240 * fVar159 - fVar170 * fStack_10c0;
              auVar18._12_4_ = fStack_123c * fVar160 - fVar175 * fStack_10bc;
              local_1158 = blendvps(auVar151,auVar18,auVar67);
              auVar133._0_4_ = fVar164 * fVar165 - fVar154 * (float)local_1258._0_4_;
              auVar133._4_4_ = fVar167 * fVar168 - fVar156 * (float)local_1258._4_4_;
              auVar133._8_4_ = fVar170 * fVar174 - fVar159 * fStack_1250;
              auVar133._12_4_ = fVar175 * fVar176 - fVar160 * fStack_124c;
              auVar162._0_4_ = fVar154 * fVar95 - fVar126 * fVar165;
              auVar162._4_4_ = fVar156 * fVar209 - fVar127 * fVar168;
              auVar162._8_4_ = fVar159 * fVar105 - fVar136 * fVar174;
              auVar162._12_4_ = fVar160 * fVar107 - fVar142 * fVar176;
              auVar68._4_4_ =
                   -(uint)(ABS(fVar156 * (float)local_1258._4_4_) < ABS(fVar127 * fVar168));
              auVar68._0_4_ =
                   -(uint)(ABS(fVar154 * (float)local_1258._0_4_) < ABS(fVar126 * fVar165));
              auVar68._8_4_ = -(uint)(ABS(fVar159 * fStack_1250) < ABS(fVar136 * fVar174));
              auVar68._12_4_ = -(uint)(ABS(fVar160 * fStack_124c) < ABS(fVar142 * fVar176));
              local_1148 = blendvps(auVar162,auVar133,auVar68);
              fVar103 = fVar158 * local_1168._0_4_ +
                        fVar199 * local_1158._0_4_ + fVar155 * local_1148._0_4_;
              fVar75 = fVar158 * local_1168._4_4_ +
                       fVar199 * local_1158._4_4_ + fVar155 * local_1148._4_4_;
              fVar106 = fVar158 * local_1168._8_4_ +
                        fVar199 * local_1158._8_4_ + fVar155 * local_1148._8_4_;
              fVar182 = fVar158 * local_1168._12_4_ +
                        fVar199 * local_1158._12_4_ + fVar155 * local_1148._12_4_;
              auVar118._0_4_ = fVar103 + fVar103;
              auVar118._4_4_ = fVar75 + fVar75;
              auVar118._8_4_ = fVar106 + fVar106;
              auVar118._12_4_ = fVar182 + fVar182;
              auVar83._0_4_ = local_10b8 * local_1158._0_4_ + fVar192 * local_1148._0_4_;
              auVar83._4_4_ = fStack_10b4 * local_1158._4_4_ + fVar195 * local_1148._4_4_;
              auVar83._8_4_ = fStack_10b0 * local_1158._8_4_ + fVar200 * local_1148._8_4_;
              auVar83._12_4_ = fStack_10ac * local_1158._12_4_ + fVar202 * local_1148._12_4_;
              fVar106 = local_10a8 * local_1168._0_4_ + auVar83._0_4_;
              fVar182 = fStack_10a4 * local_1168._4_4_ + auVar83._4_4_;
              fVar166 = fStack_10a0 * local_1168._8_4_ + auVar83._8_4_;
              fVar143 = fStack_109c * local_1168._12_4_ + auVar83._12_4_;
              auVar58 = rcpps(auVar83,auVar118);
              fVar103 = auVar58._0_4_;
              fVar75 = auVar58._4_4_;
              fVar189 = auVar58._8_4_;
              fVar194 = auVar58._12_4_;
              fVar106 = ((1.0 - auVar118._0_4_ * fVar103) * fVar103 + fVar103) * (fVar106 + fVar106)
              ;
              fVar182 = ((1.0 - auVar118._4_4_ * fVar75) * fVar75 + fVar75) * (fVar182 + fVar182);
              fVar189 = ((1.0 - auVar118._8_4_ * fVar189) * fVar189 + fVar189) * (fVar166 + fVar166)
              ;
              fVar194 = ((1.0 - auVar118._12_4_ * fVar194) * fVar194 + fVar194) *
                        (fVar143 + fVar143);
              fVar103 = *(float *)(ray + k * 4 + 0x80);
              fVar75 = *(float *)(ray + k * 4 + 0x30);
              auVar84._0_4_ = -(uint)(fVar106 <= fVar103 && fVar75 <= fVar106) & auVar187._0_4_;
              auVar84._4_4_ = -(uint)(fVar182 <= fVar103 && fVar75 <= fVar182) & auVar187._4_4_;
              auVar84._8_4_ = -(uint)(fVar189 <= fVar103 && fVar75 <= fVar189) & auVar187._8_4_;
              auVar84._12_4_ = -(uint)(fVar194 <= fVar103 && fVar75 <= fVar194) & auVar187._12_4_;
              iVar37 = movmskps(iVar37,auVar84);
              if (iVar37 != 0) {
                auVar119._4_4_ = -(uint)(auVar118._4_4_ != 0.0);
                auVar119._0_4_ = -(uint)(auVar118._0_4_ != 0.0);
                auVar119._8_4_ = -(uint)(auVar118._8_4_ != 0.0);
                auVar119._12_4_ = -(uint)(auVar118._12_4_ != 0.0);
                valid.field_0.i[0] = auVar84._0_4_ & -(uint)(auVar118._0_4_ != 0.0);
                valid.field_0.i[1] = auVar84._4_4_ & -(uint)(auVar118._4_4_ != 0.0);
                valid.field_0.i[2] = auVar84._8_4_ & -(uint)(auVar118._8_4_ != 0.0);
                valid.field_0.i[3] = auVar84._12_4_ & -(uint)(auVar118._12_4_ != 0.0);
                iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
                if (iVar37 != 0) {
                  local_10d8._8_8_ = auVar186._8_8_;
                  tNear.field_0._8_8_ = local_10d8._8_8_;
                  tNear.field_0._0_8_ = auVar186._0_8_;
                  local_1178[0] = fVar106;
                  local_1178[1] = fVar182;
                  local_1178[2] = fVar189;
                  local_1178[3] = fVar194;
                  pGVar11 = (context->scene->geometries).items[uVar7].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar58 = rcpps(auVar119,local_10e8);
                    fVar103 = auVar58._0_4_;
                    fVar75 = auVar58._4_4_;
                    fVar166 = auVar58._8_4_;
                    fVar143 = auVar58._12_4_;
                    fVar103 = (float)(-(uint)(1e-18 <= ABS(local_10e8._0_4_)) &
                                     (uint)(((float)DAT_01feca10 - local_10e8._0_4_ * fVar103) *
                                            fVar103 + fVar103));
                    fVar75 = (float)(-(uint)(1e-18 <= ABS(local_10e8._4_4_)) &
                                    (uint)((DAT_01feca10._4_4_ - local_10e8._4_4_ * fVar75) * fVar75
                                          + fVar75));
                    fVar166 = (float)(-(uint)(1e-18 <= ABS(local_10e8._8_4_)) &
                                     (uint)((DAT_01feca10._8_4_ - local_10e8._8_4_ * fVar166) *
                                            fVar166 + fVar166));
                    fVar143 = (float)(-(uint)(1e-18 <= ABS(local_10e8._12_4_)) &
                                     (uint)((DAT_01feca10._12_4_ - local_10e8._12_4_ * fVar143) *
                                            fVar143 + fVar143));
                    auVar102._0_4_ = fVar177 * fVar103;
                    auVar102._4_4_ = fVar178 * fVar75;
                    auVar102._8_4_ = auVar186._8_4_ * fVar166;
                    auVar102._12_4_ = auVar186._12_4_ * fVar143;
                    auVar101 = minps(auVar102,_DAT_01feca10);
                    auVar85._0_4_ = fVar103 * fVar180;
                    auVar85._4_4_ = fVar75 * fVar181;
                    auVar85._8_4_ = fVar166 * fVar183;
                    auVar85._12_4_ = fVar143 * fVar188;
                    auVar96 = minps(auVar85,_DAT_01feca10);
                    auVar58 = *(undefined1 (*) [16])local_1230;
                    auVar146 = auVar58._0_12_;
                    auVar47 = *(undefined1 (*) [16])(local_1230 + uVar27 * 4);
                    auVar129 = auVar47._0_12_;
                    if (uVar27 == 2) {
                      auVar146._0_8_ = auVar58._0_8_;
                      auVar146._8_4_ = auVar58._4_4_;
                      auVar129._0_8_ = auVar47._0_8_;
                      auVar129._8_4_ = auVar47._4_4_;
                    }
                    auVar152._4_4_ = auVar146._4_4_;
                    auVar152._8_4_ = auVar146._8_4_;
                    auVar121._0_8_ = auVar146._0_8_;
                    auVar121._8_4_ = auVar152._4_4_;
                    uVar135 = auVar129._4_4_;
                    auVar121._12_4_ = uVar135;
                    auVar120._8_8_ = auVar121._8_8_;
                    auVar120._0_4_ = auVar146._0_4_;
                    uVar38 = auVar129._0_4_;
                    auVar120._4_4_ = uVar38;
                    auVar152._0_4_ = auVar152._4_4_;
                    auVar152._12_4_ = auVar152._8_4_;
                    auVar134._0_8_ = auVar129._0_8_;
                    auVar134._8_4_ = uVar135;
                    auVar134._12_4_ = auVar129._8_4_;
                    auVar47 = ZEXT816(0);
                    auVar58 = pblendw(auVar120,auVar47,0xaa);
                    auVar150 = pblendw(auVar152,auVar47,0xaa);
                    auVar47 = pblendw(auVar134,auVar47,0xaa);
                    fVar173 = auVar101._0_4_;
                    fVar197 = auVar101._4_4_;
                    fVar198 = auVar101._8_4_;
                    fVar179 = auVar101._12_4_;
                    fVar103 = auVar96._0_4_;
                    fVar75 = auVar96._4_4_;
                    fVar166 = auVar96._8_4_;
                    fVar143 = auVar96._12_4_;
                    fVar199 = (1.0 - fVar173) - fVar103;
                    fVar155 = (1.0 - fVar197) - fVar75;
                    fVar95 = (1.0 - fVar198) - fVar166;
                    fVar158 = (1.0 - fVar179) - fVar143;
                    local_1198[1] =
                         (float)auVar58._4_4_ * 0.00012207031 * fVar155 +
                         (float)auVar47._4_4_ * 0.00012207031 * fVar75 +
                         (float)auVar150._4_4_ * 0.00012207031 * fVar197;
                    local_1198[0] =
                         (float)auVar58._0_4_ * 0.00012207031 * fVar199 +
                         (float)auVar47._0_4_ * 0.00012207031 * fVar103 +
                         (float)auVar150._0_4_ * 0.00012207031 * fVar173;
                    local_1198[2] =
                         (float)auVar58._8_4_ * 0.00012207031 * fVar95 +
                         (float)auVar47._8_4_ * 0.00012207031 * fVar166 +
                         (float)auVar150._8_4_ * 0.00012207031 * fVar198;
                    local_1198[3] =
                         (float)auVar58._12_4_ * 0.00012207031 * fVar158 +
                         (float)auVar47._12_4_ * 0.00012207031 * fVar143 +
                         (float)auVar150._12_4_ * 0.00012207031 * fVar179;
                    local_1188[1] =
                         fVar155 * (float)(uVar38 >> 0x10) * 0.00012207031 +
                         (float)(uVar135 >> 0x10) * 0.00012207031 * fVar75 +
                         (float)(auVar152._4_4_ >> 0x10) * 0.00012207031 * fVar197;
                    local_1188[0] =
                         fVar199 * (float)(auVar120._0_4_ >> 0x10) * 0.00012207031 +
                         (float)(uVar38 >> 0x10) * 0.00012207031 * fVar103 +
                         (float)(auVar152._4_4_ >> 0x10) * 0.00012207031 * fVar173;
                    local_1188[2] =
                         fVar95 * (float)(auVar152._4_4_ >> 0x10) * 0.00012207031 +
                         (float)(uVar135 >> 0x10) * 0.00012207031 * fVar166 +
                         (float)(auVar152._8_4_ >> 0x10) * 0.00012207031 * fVar198;
                    local_1188[3] =
                         fVar158 * (float)(uVar135 >> 0x10) * 0.00012207031 +
                         (float)(auVar129._8_4_ >> 0x10) * 0.00012207031 * fVar143 +
                         (float)(auVar152._8_4_ >> 0x10) * 0.00012207031 * fVar179;
                    auVar24._4_4_ = fVar182;
                    auVar24._0_4_ = fVar106;
                    auVar24._8_4_ = fVar189;
                    auVar24._12_4_ = fVar194;
                    auVar47 = blendvps(_DAT_01feb9f0,auVar24,(undefined1  [16])valid.field_0);
                    auVar122._4_4_ = auVar47._0_4_;
                    auVar122._0_4_ = auVar47._4_4_;
                    auVar122._8_4_ = auVar47._12_4_;
                    auVar122._12_4_ = auVar47._8_4_;
                    auVar58 = minps(auVar122,auVar47);
                    auVar86._0_8_ = auVar58._8_8_;
                    auVar86._8_4_ = auVar58._0_4_;
                    auVar86._12_4_ = auVar58._4_4_;
                    auVar58 = minps(auVar86,auVar58);
                    auVar87._0_8_ =
                         CONCAT44(-(uint)(auVar58._4_4_ == auVar47._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar58._0_4_ == auVar47._0_4_) & valid.field_0.i[0]);
                    auVar87._8_4_ = -(uint)(auVar58._8_4_ == auVar47._8_4_) & valid.field_0.i[2];
                    auVar87._12_4_ = -(uint)(auVar58._12_4_ == auVar47._12_4_) & valid.field_0.i[3];
                    iVar37 = movmskps(uVar39,auVar87);
                    aVar69 = valid.field_0;
                    if (iVar37 != 0) {
                      aVar69.i[2] = auVar87._8_4_;
                      aVar69._0_8_ = auVar87._0_8_;
                      aVar69.i[3] = auVar87._12_4_;
                    }
                    uVar39 = movmskps(iVar37,(undefined1  [16])aVar69);
                    lVar46 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                      }
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar103 = local_1198[lVar46];
                      fVar75 = local_1188[lVar46];
                      uVar40 = *(undefined4 *)(local_1168 + lVar46 * 4);
                      uVar5 = *(undefined4 *)(local_1158 + lVar46 * 4);
                      uVar6 = *(undefined4 *)(local_1148 + lVar46 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_1178[lVar46];
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar40;
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar6;
                      *(float *)(ray + k * 4 + 0xf0) = fVar103;
                      *(float *)(ray + k * 4 + 0x100) = fVar75;
                      *(undefined4 *)(ray + k * 4 + 0x110) = (undefined4)uStack_12c0;
                      *(uint *)(ray + k * 4 + 0x120) = uVar7;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      uVar44 = local_1118;
                    }
                    else {
                      local_12d8 = CONCAT44(uVar7,uVar7);
                      local_12c8 = CONCAT44((undefined4)uStack_12c0,(undefined4)uStack_12c0);
                      uStack_12c0._4_4_ = (undefined4)uStack_12c0;
                      uVar9 = *local_1120;
                      uVar19 = local_1120[1];
                      local_1228 = uVar27;
                      local_1220 = uVar41;
                      local_10d8 = auVar57;
                      do {
                        uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_fd8 = local_1198[lVar46];
                        fVar103 = local_1188[lVar46];
                        *(float *)(ray + k * 4 + 0x80) = local_1178[lVar46];
                        args.context = context->user;
                        local_fc8._4_4_ = fVar103;
                        local_fc8._0_4_ = fVar103;
                        local_fc8._8_4_ = fVar103;
                        local_fc8._12_4_ = fVar103;
                        local_1008 = *(undefined4 *)(local_1168 + lVar46 * 4);
                        uVar5 = *(undefined4 *)(local_1158 + lVar46 * 4);
                        local_fe8 = *(undefined4 *)(local_1148 + lVar46 * 4);
                        local_ff8._4_4_ = uVar5;
                        local_ff8._0_4_ = uVar5;
                        local_ff8._8_4_ = uVar5;
                        local_ff8._12_4_ = uVar5;
                        uStack_1004 = local_1008;
                        uStack_1000 = local_1008;
                        uStack_ffc = local_1008;
                        uStack_fe4 = local_fe8;
                        uStack_fe0 = local_fe8;
                        uStack_fdc = local_fe8;
                        fStack_fd4 = local_fd8;
                        fStack_fd0 = local_fd8;
                        fStack_fcc = local_fd8;
                        local_fb8 = local_12c8;
                        uStack_fb0 = uStack_12c0;
                        local_fa8 = local_12d8;
                        uStack_fa0 = CONCAT44(uVar7,uVar7);
                        local_f98 = (args.context)->instID[0];
                        uStack_f94 = local_f98;
                        uStack_f90 = local_f98;
                        uStack_f8c = local_f98;
                        local_f88 = (args.context)->instPrimID[0];
                        uStack_f84 = local_f88;
                        uStack_f80 = local_f88;
                        uStack_f7c = local_f88;
                        args.valid = (int *)&local_1268;
                        pRVar36 = (RTCIntersectArguments *)pGVar11->userPtr;
                        args.hit = (RTCHitN *)&local_1008;
                        args.N = 4;
                        pRVar31 = (RTCRayN *)pGVar11->intersectionFilterN;
                        local_1268 = uVar9;
                        uStack_1260 = uVar19;
                        args.geometryUserPtr = pRVar36;
                        args.ray = (RTCRayN *)ray;
                        if (pRVar31 != (RTCRayN *)0x0) {
                          pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                        }
                        auVar22._8_8_ = uStack_1260;
                        auVar22._0_8_ = local_1268;
                        if (auVar22 == (undefined1  [16])0x0) {
                          auVar91._8_4_ = 0xffffffff;
                          auVar91._0_8_ = 0xffffffffffffffff;
                          auVar91._12_4_ = 0xffffffff;
                          auVar91 = auVar91 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar36 = context->args;
                          pRVar31 = (RTCRayN *)pRVar36->filter;
                          if ((pRVar31 != (RTCRayN *)0x0) &&
                             (((pRVar36->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                          }
                          auVar23._8_8_ = uStack_1260;
                          auVar23._0_8_ = local_1268;
                          auVar72._0_4_ = -(uint)((int)local_1268 == 0);
                          auVar72._4_4_ = -(uint)((int)((ulong)local_1268 >> 0x20) == 0);
                          auVar72._8_4_ = -(uint)((int)uStack_1260 == 0);
                          auVar72._12_4_ = -(uint)((int)((ulong)uStack_1260 >> 0x20) == 0);
                          auVar91 = auVar72 ^ _DAT_01febe20;
                          if (auVar23 != (undefined1  [16])0x0) {
                            auVar57 = blendvps(*(undefined1 (*) [16])args.hit,
                                               *(undefined1 (*) [16])(args.ray + 0xc0),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0xc0) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                               *(undefined1 (*) [16])(args.ray + 0xd0),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0xd0) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                               *(undefined1 (*) [16])(args.ray + 0xe0),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0xe0) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                               *(undefined1 (*) [16])(args.ray + 0xf0),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0xf0) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                               *(undefined1 (*) [16])(args.ray + 0x100),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0x100) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                               *(undefined1 (*) [16])(args.ray + 0x110),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0x110) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                               *(undefined1 (*) [16])(args.ray + 0x120),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0x120) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                               *(undefined1 (*) [16])(args.ray + 0x130),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0x130) = auVar57;
                            auVar57 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                               *(undefined1 (*) [16])(args.ray + 0x140),auVar72);
                            *(undefined1 (*) [16])(args.ray + 0x140) = auVar57;
                            pRVar31 = args.ray;
                            pRVar36 = (RTCIntersectArguments *)args.hit;
                          }
                        }
                        if ((_DAT_01fecb20 & auVar91) == (undefined1  [16])0x0) {
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar40;
                        }
                        valid.field_0.v[lVar46] = 0.0;
                        fVar103 = *(float *)(ray + k * 4 + 0x80);
                        valid.field_0.i[0] = -(uint)(fVar106 <= fVar103) & valid.field_0.i[0];
                        valid.field_0.i[1] = -(uint)(fVar182 <= fVar103) & valid.field_0.i[1];
                        valid.field_0.i[2] = -(uint)(fVar189 <= fVar103) & valid.field_0.i[2];
                        valid.field_0.i[3] = -(uint)(fVar194 <= fVar103) & valid.field_0.i[3];
                        iVar37 = movmskps((int)pRVar31,(undefined1  [16])valid.field_0);
                        if (iVar37 != 0) {
                          auVar58 = blendvps(_DAT_01feb9f0,auVar24,(undefined1  [16])valid.field_0);
                          auVar124._4_4_ = auVar58._0_4_;
                          auVar124._0_4_ = auVar58._4_4_;
                          auVar124._8_4_ = auVar58._12_4_;
                          auVar124._12_4_ = auVar58._8_4_;
                          auVar57 = minps(auVar124,auVar58);
                          auVar92._0_8_ = auVar57._8_8_;
                          auVar92._8_4_ = auVar57._0_4_;
                          auVar92._12_4_ = auVar57._4_4_;
                          auVar57 = minps(auVar92,auVar57);
                          auVar93._0_8_ =
                               CONCAT44(-(uint)(auVar57._4_4_ == auVar58._4_4_) & valid.field_0.i[1]
                                        ,-(uint)(auVar57._0_4_ == auVar58._0_4_) &
                                         valid.field_0.i[0]);
                          auVar93._8_4_ =
                               -(uint)(auVar57._8_4_ == auVar58._8_4_) & valid.field_0.i[2];
                          auVar93._12_4_ =
                               -(uint)(auVar57._12_4_ == auVar58._12_4_) & valid.field_0.i[3];
                          iVar33 = movmskps((int)pRVar36,auVar93);
                          aVar73 = valid.field_0;
                          if (iVar33 != 0) {
                            aVar73.i[2] = auVar93._8_4_;
                            aVar73._0_8_ = auVar93._0_8_;
                            aVar73.i[3] = auVar93._12_4_;
                          }
                          uVar40 = movmskps(iVar33,(undefined1  [16])aVar73);
                          uVar44 = CONCAT44((int)((ulong)pRVar36 >> 0x20),uVar40);
                          lVar46 = 0;
                          if (uVar44 != 0) {
                            for (; (uVar44 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                            }
                          }
                        }
                        uVar44 = local_1118;
                      } while ((char)iVar37 != '\0');
                    }
                  }
                }
              }
            }
            sVar34 = 0;
            auVar57 = local_10f8;
            fVar189 = local_1048;
            fVar166 = fStack_1044;
            fVar143 = fStack_1040;
            fVar173 = fStack_103c;
            fVar194 = local_1058;
            fVar197 = fStack_1054;
            fVar198 = fStack_1050;
            fVar179 = fStack_104c;
            fVar199 = local_1068;
            fVar155 = fStack_1064;
            fVar95 = fStack_1060;
            fVar158 = fStack_105c;
            fVar208 = local_1078;
            fVar74 = fStack_1074;
            fVar94 = fStack_1070;
            fVar104 = fStack_106c;
            fVar209 = local_1088;
            fVar105 = fStack_1084;
            fVar107 = fStack_1080;
            fVar108 = fStack_107c;
            fVar103 = local_1108;
            fVar125 = fStack_1104;
            fVar126 = fStack_1100;
            fVar127 = fStack_10fc;
            fVar75 = local_1018;
            fVar136 = fStack_1014;
            fVar142 = fStack_1010;
            fVar144 = fStack_100c;
            fVar106 = local_1028;
            fVar154 = fStack_1024;
            fVar156 = fStack_1020;
            fVar157 = fStack_101c;
            fVar182 = local_1038;
            fVar159 = fStack_1034;
            fVar160 = fStack_1030;
            fVar163 = fStack_102c;
          }
        }
        else {
          pGVar32 = (GridSOA *)(uVar28 & 0xfffffffffffffff0);
          sVar34 = *(size_t *)(pGVar32 + (ulong)*(uint *)(pGVar32 + 0x2c) + 0x30);
          (pre->super_Precalculations).grid = pGVar32;
        }
        uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar58._4_4_ = uVar40;
        auVar58._0_4_ = uVar40;
        auVar58._8_4_ = uVar40;
        auVar58._12_4_ = uVar40;
        if (sVar34 != 0) {
          (local_1110->ptr).ptr = sVar34;
          local_1110->dist = 0;
          local_1110 = local_1110 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }